

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.h
# Opt level: O0

double __thiscall
TransitionObservationIndependentMADPDiscrete::GetTransitionProbability
          (TransitionObservationIndependentMADPDiscrete *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *sIs,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *aIs,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *sucSIs)

{
  value_type vVar1;
  value_type vVar2;
  ulong uVar3;
  const_reference pvVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RCX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  long *in_RDI;
  double dVar5;
  Index agI;
  double p;
  Index in_stack_ffffffffffffffac;
  TransitionObservationIndependentMADPDiscrete *in_stack_ffffffffffffffb0;
  uint local_2c;
  double local_28;
  
  local_28 = 1.0;
  local_2c = 0;
  while( true ) {
    uVar3 = (**(code **)(*in_RDI + 0x10))();
    if (uVar3 <= local_2c) {
      return local_28;
    }
    in_stack_ffffffffffffffb0 =
         (TransitionObservationIndependentMADPDiscrete *)
         GetIndividualMADPD(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_RSI,(ulong)local_2c);
    vVar1 = *pvVar4;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_RDX,(ulong)local_2c);
    vVar2 = *pvVar4;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_RCX,(ulong)local_2c);
    dVar5 = (double)(**(code **)(*(long *)&in_stack_ffffffffffffffb0->
                                           super_MultiAgentDecisionProcess + 0x110))
                              (in_stack_ffffffffffffffb0,vVar1,vVar2,*pvVar4);
    local_28 = dVar5 * local_28;
    if ((local_28 == 0.0) && (!NAN(local_28))) break;
    local_2c = local_2c + 1;
  }
  return local_28;
}

Assistant:

double GetTransitionProbability(const std::vector<Index> &sIs,
                                    const std::vector<Index> &aIs,
                                    const std::vector<Index> &sucSIs) const
        { 
            double p=1;
            for(Index agI = 0; agI < GetNrAgents(); agI++)
            {
                p*=GetIndividualMADPD(agI)->GetTransitionProbability(
                    sIs[agI],
                    aIs[agI],
                    sucSIs[agI]);
                if(p==0)
                    break;
            }
            return(p);
        }